

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  stbi_uc *psVar10;
  char *pcVar11;
  byte *pbVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  stbi_uc *psVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  byte *pbVar30;
  long in_FS_OFFSET;
  bool bVar31;
  stbi_uc *local_e8;
  stbi_uc *local_e0;
  byte *local_c0;
  ulong local_78;
  ulong uVar18;
  
  uVar28 = (ulong)x;
  bVar31 = depth == 0x10;
  uVar5 = x * out_n;
  uVar6 = uVar5 << bVar31;
  a_00 = a->s->img_n;
  lVar24 = (long)a_00;
  uVar7 = a_00 << bVar31;
  psVar10 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar31,0);
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    pcVar11 = "Out of memory";
  }
  else {
    iVar8 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar8 != 0) {
      uVar9 = a_00 * x;
      uVar16 = uVar9 * depth + 7 >> 3;
      uVar18 = (ulong)uVar16;
      if ((uVar16 + 1) * y <= raw_len) {
        lVar27 = -(ulong)uVar6;
        lVar25 = (long)(out_n << bVar31);
        lVar23 = -lVar25;
        uVar22 = 0;
        uVar17 = 0;
        local_78 = uVar28;
        do {
          if (uVar22 == y) {
            if (depth < 8) {
              uVar7 = 0;
              for (uVar22 = 0; uVar22 != y; uVar22 = uVar22 + 1) {
                bVar4 = 1;
                if (color == 0) {
                  bVar4 = ""[depth];
                }
                uVar29 = (ulong)uVar7;
                psVar10 = a->out;
                uVar15 = (ulong)(uVar6 * (int)uVar22);
                if (depth == 4) {
                  lVar24 = (uVar5 - uVar18) + uVar29;
                  lVar23 = 0;
                  for (uVar16 = uVar9; 1 < (int)uVar16; uVar16 = uVar16 - 2) {
                    psVar10[lVar23 * 2 + uVar29] = (psVar10[lVar23 + lVar24] >> 4) * bVar4;
                    psVar10[lVar23 * 2 + uVar29 + 1] = (psVar10[lVar23 + lVar24] & 0xf) * bVar4;
                    lVar23 = lVar23 + 1;
                  }
                  if (uVar16 == 1) {
                    psVar10[lVar23 * 2 + uVar29] = (psVar10[lVar23 + lVar24] >> 4) * bVar4;
                  }
                }
                else {
                  pbVar30 = psVar10 + ((uVar5 + uVar15) - uVar18);
                  if (depth == 2) {
                    psVar10 = psVar10 + uVar29 + 3;
                    for (uVar16 = uVar9; 3 < (int)uVar16; uVar16 = uVar16 - 4) {
                      psVar10[-3] = (*pbVar30 >> 6) * bVar4;
                      psVar10[-2] = (*pbVar30 >> 4 & 3) * bVar4;
                      psVar10[-1] = (*pbVar30 >> 2 & 3) * bVar4;
                      *psVar10 = (*pbVar30 & 3) * bVar4;
                      pbVar30 = pbVar30 + 1;
                      psVar10 = psVar10 + 4;
                    }
                    if (((0 < (int)uVar16) && (psVar10[-3] = (*pbVar30 >> 6) * bVar4, uVar16 != 1))
                       && (psVar10[-2] = (*pbVar30 >> 4 & 3) * bVar4, uVar16 == 3)) {
                      psVar10[-1] = (*pbVar30 >> 2 & 3) * bVar4;
                    }
                  }
                  else if (depth == 1) {
                    pbVar12 = psVar10 + uVar29 + 7;
                    for (uVar16 = uVar9; 7 < (int)uVar16; uVar16 = uVar16 - 8) {
                      pbVar12[-7] = (char)*pbVar30 >> 7 & bVar4;
                      pbVar12[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar4;
                      pbVar12[-5] = (char)(*pbVar30 << 2) >> 7 & bVar4;
                      pbVar12[-4] = (char)(*pbVar30 << 3) >> 7 & bVar4;
                      pbVar12[-3] = (char)(*pbVar30 << 4) >> 7 & bVar4;
                      pbVar12[-2] = (char)(*pbVar30 << 5) >> 7 & bVar4;
                      pbVar12[-1] = (char)(*pbVar30 << 6) >> 7 & bVar4;
                      bVar21 = bVar4;
                      if ((*pbVar30 & 1) == 0) {
                        bVar21 = 0;
                      }
                      *pbVar12 = bVar21;
                      pbVar30 = pbVar30 + 1;
                      pbVar12 = pbVar12 + 8;
                    }
                    if (((((0 < (int)uVar16) &&
                          (pbVar12[-7] = (char)*pbVar30 >> 7 & bVar4, uVar16 != 1)) &&
                         ((pbVar12[-6] = (char)(*pbVar30 * '\x02') >> 7 & bVar4, 2 < uVar16 &&
                          ((pbVar12[-5] = (char)(*pbVar30 << 2) >> 7 & bVar4, uVar16 != 3 &&
                           (pbVar12[-4] = (char)(*pbVar30 << 3) >> 7 & bVar4, 4 < uVar16)))))) &&
                        (pbVar12[-3] = (char)(*pbVar30 << 4) >> 7 & bVar4, uVar16 != 5)) &&
                       (pbVar12[-2] = (char)(*pbVar30 << 5) >> 7 & bVar4, uVar16 == 7)) {
                      pbVar12[-1] = (char)(*pbVar30 << 6) >> 7 & bVar4;
                    }
                  }
                }
                if (a_00 != out_n) {
                  psVar10 = a->out;
                  iVar8 = x - 1;
                  uVar29 = uVar28 * 3;
                  uVar16 = x * 4;
                  if (a_00 == 1) {
                    uVar16 = x * 2 - 1;
                    for (iVar8 = 0; -1 < (int)((x - 1) + iVar8); iVar8 = iVar8 + -1) {
                      psVar10[uVar16 + uVar15] = 0xff;
                      psVar10[(uVar16 - 1) + uVar15] =
                           psVar10[((x - 1) + iVar8 & 0x7fffffff) + uVar15];
                      uVar16 = uVar16 - 2;
                    }
                  }
                  else {
                    while( true ) {
                      uVar29 = uVar29 - 3;
                      if (iVar8 < 0) break;
                      psVar10[(uVar16 - 1) + uVar15] = 0xff;
                      uVar20 = uVar29 & 0xffffffff;
                      psVar10[(uVar16 - 2) + uVar15] = psVar10[uVar20 + uVar15 + 2];
                      psVar10[(uVar16 - 3) + uVar15] = psVar10[uVar20 + uVar15 + 1];
                      psVar10[(uVar16 - 4) + uVar15] = psVar10[uVar20 + uVar15];
                      iVar8 = iVar8 + -1;
                      uVar16 = uVar16 - 4;
                    }
                  }
                }
                uVar7 = uVar7 + uVar6;
              }
              return 1;
            }
            if (depth != 0x10) {
              return 1;
            }
            psVar10 = a->out;
            for (lVar24 = 0; uVar5 * y != (int)lVar24; lVar24 = lVar24 + 1) {
              puVar1 = (ushort *)(psVar10 + lVar24 * 2);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            }
            return 1;
          }
          uVar15 = (ulong)*raw;
          if (4 < uVar15) break;
          local_e8 = a->out + uVar6 * (int)uVar22;
          if (depth < 8) {
            if (x < uVar16) break;
            local_e8 = local_e8 + (uVar5 - uVar16);
            uVar7 = 1;
            local_78 = uVar18;
          }
          if (uVar22 == 0) {
            uVar15 = (ulong)""[uVar15];
          }
          uVar29 = 0;
          if (0 < (int)uVar7) {
            uVar29 = (ulong)uVar7;
          }
          for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
            switch(uVar15) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar4 = raw[uVar20 + 1];
              break;
            case 2:
              bVar4 = local_e8[uVar20 + lVar27];
              goto LAB_0015ce4c;
            case 3:
              bVar4 = local_e8[uVar20 + lVar27] >> 1;
LAB_0015ce4c:
              bVar4 = bVar4 + raw[uVar20 + 1];
              break;
            case 4:
              bVar4 = raw[uVar20 + 1];
              iVar8 = stbi__paeth(0,(uint)local_e8[uVar20 + lVar27],0);
              bVar4 = (char)iVar8 + bVar4;
              break;
            default:
              goto switchD_0015ce02_default;
            }
            local_e8[uVar20] = bVar4;
switchD_0015ce02_default:
          }
          lVar13 = (long)(int)uVar7;
          if (depth == 8) {
            lVar14 = (long)out_n;
            lVar2 = lVar24;
            if (a_00 != out_n) {
              local_e8[lVar24] = 0xff;
            }
LAB_0015cebd:
            local_c0 = raw + lVar2 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar14 = lVar25;
              lVar2 = lVar13;
              if (a_00 != out_n) {
                local_e8[lVar13] = 0xff;
                local_e8[lVar13 + 1] = 0xff;
              }
              goto LAB_0015cebd;
            }
            local_c0 = raw + 2;
            lVar14 = 1;
          }
          psVar10 = local_e8 + lVar14;
          local_e0 = local_e8 + lVar14 + lVar27;
          if (a_00 == out_n || depth < 8) {
            uVar19 = ((int)local_78 + -1) * uVar7;
            switch(uVar15) {
            case 0:
              memcpy(psVar10,local_c0,(long)(int)uVar19);
              break;
            case 1:
              uVar3 = uVar19;
              if ((int)uVar19 < 1) {
                uVar3 = 0;
              }
              for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                psVar10[uVar15] = psVar10[uVar15 - lVar13] + local_c0[uVar15];
              }
              break;
            case 2:
              uVar3 = uVar19;
              if ((int)uVar19 < 1) {
                uVar3 = 0;
              }
              for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                psVar10[uVar15] = psVar10[uVar15 + lVar27] + local_c0[uVar15];
              }
              break;
            case 3:
              uVar3 = uVar19;
              if ((int)uVar19 < 1) {
                uVar3 = 0;
              }
              uVar15 = (ulong)uVar3;
              pbVar30 = local_c0;
              while (bVar31 = uVar15 != 0, uVar15 = uVar15 - 1, bVar31) {
                *psVar10 = (char)((uint)psVar10[-lVar13] + (uint)psVar10[lVar27] >> 1) + *pbVar30;
                psVar10 = psVar10 + 1;
                pbVar30 = pbVar30 + 1;
              }
              break;
            case 4:
              uVar3 = uVar19;
              if ((int)uVar19 < 1) {
                uVar3 = 0;
              }
              for (uVar15 = 0; uVar15 != uVar3; uVar15 = uVar15 + 1) {
                bVar4 = local_c0[uVar15];
                iVar8 = stbi__paeth((uint)psVar10[uVar15 - lVar13],(uint)local_e0[uVar15],
                                    (uint)local_e0[uVar15 - lVar13]);
                psVar10[uVar15] = (char)iVar8 + bVar4;
              }
              break;
            case 5:
              uVar3 = uVar19;
              if ((int)uVar19 < 1) {
                uVar3 = 0;
              }
              for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                psVar10[uVar15] = (psVar10[uVar15 - lVar13] >> 1) + local_c0[uVar15];
              }
              break;
            case 6:
              uVar3 = uVar19;
              if ((int)uVar19 < 1) {
                uVar3 = 0;
              }
              for (uVar15 = 0; uVar3 != uVar15; uVar15 = uVar15 + 1) {
                psVar10[uVar15] = psVar10[uVar15 - lVar13] + local_c0[uVar15];
              }
            }
            local_c0 = local_c0 + (int)uVar19;
          }
          else {
            switch(uVar15) {
            case 0:
              uVar15 = uVar28;
              while (uVar19 = (int)uVar15 - 1, uVar15 = (ulong)uVar19, uVar19 != 0) {
                for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
                  psVar10[uVar20] = local_c0[uVar20];
                }
                psVar10[lVar13] = 0xff;
                local_c0 = local_c0 + lVar13;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 1:
              uVar15 = uVar28;
              while (uVar19 = (int)uVar15 - 1, uVar15 = (ulong)uVar19, uVar19 != 0) {
                for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
                  psVar10[uVar20] = psVar10[uVar20 + lVar23] + local_c0[uVar20];
                }
                psVar10[lVar13] = 0xff;
                local_c0 = local_c0 + lVar13;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 2:
              uVar15 = uVar28;
              while (uVar19 = (int)uVar15 - 1, uVar15 = (ulong)uVar19, uVar19 != 0) {
                for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
                  psVar10[uVar20] = psVar10[uVar20 + lVar27] + local_c0[uVar20];
                }
                psVar10[lVar13] = 0xff;
                local_c0 = local_c0 + lVar13;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 3:
              uVar15 = uVar28;
              while (uVar19 = (int)uVar15 - 1, uVar15 = (ulong)uVar19, pbVar30 = local_c0,
                    psVar26 = psVar10, uVar20 = uVar29, uVar19 != 0) {
                while (uVar20 != 0) {
                  *psVar26 = (char)((uint)psVar26[lVar23] + (uint)psVar26[lVar27] >> 1) + *pbVar30;
                  pbVar30 = pbVar30 + 1;
                  psVar26 = psVar26 + 1;
                  uVar20 = uVar20 - 1;
                }
                psVar10[lVar13] = 0xff;
                local_c0 = local_c0 + lVar13;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 4:
              psVar26 = local_e8 + lVar14 + lVar23;
              local_e8 = local_e8 + lVar14 + (lVar23 - (ulong)uVar6);
              uVar15 = uVar28;
              while (uVar19 = (int)uVar15 - 1, uVar19 != 0) {
                for (uVar15 = 0; uVar29 != uVar15; uVar15 = uVar15 + 1) {
                  bVar4 = local_c0[uVar15];
                  iVar8 = stbi__paeth((uint)psVar26[uVar15],(uint)local_e0[uVar15],
                                      (uint)local_e8[uVar15]);
                  psVar10[uVar15] = (char)iVar8 + bVar4;
                }
                psVar10[lVar13] = 0xff;
                local_c0 = local_c0 + lVar13;
                psVar10 = psVar10 + lVar25;
                local_e0 = local_e0 + lVar25;
                psVar26 = psVar26 + lVar25;
                local_e8 = local_e8 + lVar25;
                uVar15 = (ulong)uVar19;
              }
              break;
            case 5:
              uVar15 = uVar28;
              while (uVar19 = (int)uVar15 - 1, uVar15 = (ulong)uVar19, uVar19 != 0) {
                for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
                  psVar10[uVar20] = (psVar10[uVar20 + lVar23] >> 1) + local_c0[uVar20];
                }
                psVar10[lVar13] = 0xff;
                local_c0 = local_c0 + lVar13;
                psVar10 = psVar10 + lVar25;
              }
              break;
            case 6:
              uVar15 = uVar28;
              while (uVar19 = (int)uVar15 - 1, uVar15 = (ulong)uVar19, uVar19 != 0) {
                for (uVar20 = 0; uVar29 != uVar20; uVar20 = uVar20 + 1) {
                  psVar10[uVar20] = psVar10[uVar20 + lVar23] + local_c0[uVar20];
                }
                psVar10[lVar13] = 0xff;
                local_c0 = local_c0 + lVar13;
                psVar10 = psVar10 + lVar25;
              }
            }
            if (depth == 0x10) {
              psVar10 = a->out + (long)(int)(uVar7 + 1) + (ulong)uVar17;
              uVar15 = uVar28;
              while (iVar8 = (int)uVar15, uVar15 = (ulong)(iVar8 - 1), iVar8 != 0) {
                *psVar10 = 0xff;
                psVar10 = psVar10 + lVar25;
              }
            }
          }
          uVar22 = uVar22 + 1;
          uVar17 = uVar17 + uVar6;
          raw = local_c0;
        } while( true );
      }
    }
    pcVar11 = "Corrupt PNG";
  }
  *(char **)(in_FS_OFFSET + -0x20) = pcVar11;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         if (img_width_bytes > x) return stbi__err("invalid width","Corrupt PNG");
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }